

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O2

void ZopfliLZ77GetHistogram
               (ZopfliLZ77Store *lz77,size_t lstart,size_t lend,size_t *ll_counts,size_t *d_counts)

{
  long lVar1;
  size_t d_counts2 [32];
  size_t ll_counts2 [288];
  size_t local_a28 [32];
  size_t local_928 [288];
  
  if (lend < lstart + 0x360) {
    memset(ll_counts,0,0x900);
    memset(d_counts,0,0x100);
    for (; lstart < lend; lstart = lstart + 1) {
      ll_counts[lz77->ll_symbol[lstart]] = ll_counts[lz77->ll_symbol[lstart]] + 1;
      if (lz77->dists[lstart] != 0) {
        d_counts[lz77->d_symbol[lstart]] = d_counts[lz77->d_symbol[lstart]] + 1;
      }
    }
  }
  else {
    ZopfliLZ77GetHistogramAt(lz77,lend - 1,ll_counts,d_counts);
    if (lstart != 0) {
      ZopfliLZ77GetHistogramAt(lz77,lstart - 1,local_928,local_a28);
      for (lVar1 = 0; lVar1 != 0x120; lVar1 = lVar1 + 1) {
        ll_counts[lVar1] = ll_counts[lVar1] - local_928[lVar1];
      }
      for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
        d_counts[lVar1] = d_counts[lVar1] - local_a28[lVar1];
      }
    }
  }
  return;
}

Assistant:

void ZopfliLZ77GetHistogram(const ZopfliLZ77Store* lz77,
                           size_t lstart, size_t lend,
                           size_t* ll_counts, size_t* d_counts) {
  size_t i;
  if (lstart + ZOPFLI_NUM_LL * 3 > lend) {
    memset(ll_counts, 0, sizeof(*ll_counts) * ZOPFLI_NUM_LL);
    memset(d_counts, 0, sizeof(*d_counts) * ZOPFLI_NUM_D);
    for (i = lstart; i < lend; i++) {
      ll_counts[lz77->ll_symbol[i]]++;
      if (lz77->dists[i] != 0) d_counts[lz77->d_symbol[i]]++;
    }
  } else {
    /* Subtract the cumulative histograms at the end and the start to get the
    histogram for this range. */
    ZopfliLZ77GetHistogramAt(lz77, lend - 1, ll_counts, d_counts);
    if (lstart > 0) {
      size_t ll_counts2[ZOPFLI_NUM_LL];
      size_t d_counts2[ZOPFLI_NUM_D];
      ZopfliLZ77GetHistogramAt(lz77, lstart - 1, ll_counts2, d_counts2);

      for (i = 0; i < ZOPFLI_NUM_LL; i++) {
        ll_counts[i] -= ll_counts2[i];
      }
      for (i = 0; i < ZOPFLI_NUM_D; i++) {
        d_counts[i] -= d_counts2[i];
      }
    }
  }
}